

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O0

ssize_t __thiscall QMetaProperty::write(QMetaProperty *this,int __fd,void *__buf,size_t __n)

{
  QMetaTypeInterface **ppQVar1;
  QMetaType targetType;
  bool bVar2;
  char *pcVar3;
  QMetaObject *pQVar4;
  void *pvVar5;
  QMetaObjectPrivate *pQVar6;
  Call cl;
  int __c;
  int __c_00;
  undefined4 in_register_00000034;
  QObject *object;
  long in_FS_OFFSET;
  optional<unsigned_long_long> oVar7;
  int flags;
  int status;
  QMetaType t;
  optional<unsigned_long_long> value;
  void *argv [4];
  QMetaProperty *in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  QMetaProperty *in_stack_fffffffffffffe58;
  QMetaType in_stack_fffffffffffffe68;
  StaticMetacallFunction p_Var8;
  undefined7 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe77;
  _Storage<unsigned_long_long,_true> in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  QMetaEnum *in_stack_fffffffffffffe98;
  QVariant *in_stack_fffffffffffffeb0;
  bool local_141;
  bool local_131;
  undefined7 in_stack_fffffffffffffee8;
  byte in_stack_fffffffffffffeef;
  bool local_f1;
  undefined4 local_e8;
  int local_e4;
  QMetaTypeInterface *local_e0;
  QMetaTypeInterface *local_d8;
  char *in_stack_ffffffffffffff58;
  QMetaType local_80;
  _Storage<unsigned_long_long,_true> local_78;
  undefined1 *local_70;
  void *local_68;
  void *local_60;
  int *local_58;
  undefined4 *local_50;
  long local_8;
  
  object = (QObject *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((object == (QObject *)0x0) || (bVar2 = isWritable(in_stack_fffffffffffffe48), !bVar2)) {
    local_f1 = false;
    goto LAB_0036795c;
  }
  local_80.d_ptr = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
  ppQVar1 = (this->mobj->d).metaTypes;
  pcVar3 = Data::index(&this->data,(char *)this->mobj,__c);
  QMetaType::QMetaType(&local_80,ppQVar1[(int)pcVar3]);
  QMetaType::fromType<QVariant>();
  bVar2 = ::operator!=((QMetaType *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       (QMetaType *)in_stack_fffffffffffffe48);
  local_131 = false;
  if (bVar2) {
    ::QVariant::metaType((QVariant *)in_stack_fffffffffffffe48);
    local_131 = ::operator!=((QMetaType *)
                             CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                             (QMetaType *)in_stack_fffffffffffffe48);
  }
  if (local_131 != false) {
    bVar2 = isEnumType(in_stack_fffffffffffffe58);
    local_141 = false;
    if (bVar2) {
      pQVar4 = QMetaType::metaObject
                         ((QMetaType *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50)
                         );
      local_141 = false;
      if (pQVar4 == (QMetaObject *)0x0) {
        ::QVariant::metaType((QVariant *)in_stack_fffffffffffffe48);
        QMetaType::fromType<QString>();
        local_141 = ::operator==((QMetaType *)
                                 CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                                 (QMetaType *)in_stack_fffffffffffffe48);
      }
    }
    if (local_141 != false) {
      local_78 = (_Storage<unsigned_long_long,_true>)&DAT_aaaaaaaaaaaaaaaa;
      local_70 = &DAT_aaaaaaaaaaaaaaaa;
      bVar2 = isFlagType((QMetaProperty *)
                         CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      in_stack_fffffffffffffeef = 0;
      if (bVar2) {
        ::QVariant::toByteArray((QVariant *)in_stack_fffffffffffffe48);
        in_stack_fffffffffffffeef = 1;
        in_stack_fffffffffffffeb0 =
             (QVariant *)QByteArray::operator_cast_to_char_((QByteArray *)0x36751d);
        oVar7 = QMetaEnum::keysToValue64((QMetaEnum *)object,in_stack_ffffffffffffff58);
        local_78._M_value =
             oVar7.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long_long>._M_payload;
        local_70 = (undefined1 *)
                   CONCAT71(local_70._1_7_,
                            oVar7.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_long_long>._M_engaged);
      }
      else {
        ::QVariant::toByteArray((QVariant *)in_stack_fffffffffffffe48);
        QByteArray::operator_cast_to_char_((QByteArray *)0x367595);
        oVar7 = QMetaEnum::keyToValue64
                          (in_stack_fffffffffffffe98,
                           (char *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
        in_stack_fffffffffffffe78._M_value =
             oVar7.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long_long>._M_payload;
        in_stack_fffffffffffffe77 =
             oVar7.super__Optional_base<unsigned_long_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long_long>._M_engaged;
        local_70 = (undefined1 *)CONCAT71(local_70._1_7_,in_stack_fffffffffffffe77);
        local_78._M_value = in_stack_fffffffffffffe78._M_value;
        QByteArray::~QByteArray((QByteArray *)0x3675e7);
      }
      if ((in_stack_fffffffffffffeef & 1) != 0) {
        QByteArray::~QByteArray((QByteArray *)0x367600);
      }
      bVar2 = std::optional::operator_cast_to_bool((optional<unsigned_long_long> *)0x36760d);
      if (bVar2) {
        std::optional<unsigned_long_long>::operator*((optional<unsigned_long_long> *)0x367623);
        ::QVariant::QVariant
                  ((QVariant *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                   (qlonglong)in_stack_fffffffffffffe58);
        ::QVariant::operator=
                  ((QVariant *)in_stack_fffffffffffffe58,
                   (QVariant *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
        ::QVariant::~QVariant
                  ((QVariant *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      }
    }
    bVar2 = ::QVariant::isValid((QVariant *)
                                CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    if (bVar2) {
      local_e0 = local_80.d_ptr;
      targetType.d_ptr._7_1_ = in_stack_fffffffffffffeef;
      targetType.d_ptr._0_7_ = in_stack_fffffffffffffee8;
      bVar2 = ::QVariant::convert(in_stack_fffffffffffffeb0,targetType);
      if (!bVar2) {
        local_f1 = false;
        goto LAB_0036795c;
      }
    }
    else {
      bVar2 = isResettable(in_stack_fffffffffffffe48);
      if (bVar2) {
        local_f1 = reset((QMetaProperty *)in_stack_fffffffffffffe78,
                         (QObject *)CONCAT17(in_stack_fffffffffffffe77,in_stack_fffffffffffffe70));
        goto LAB_0036795c;
      }
      local_d8 = local_80.d_ptr;
      ::QVariant::QVariant
                ((QVariant *)in_stack_fffffffffffffe58,in_stack_fffffffffffffe68,
                 (void *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      ::QVariant::operator=
                ((QVariant *)in_stack_fffffffffffffe58,
                 (QVariant *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      ::QVariant::~QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    }
  }
  local_e4 = -1;
  local_e8 = 0;
  local_68 = (void *)0x0;
  local_58 = &local_e4;
  local_50 = &local_e8;
  local_60 = __buf;
  QMetaType::fromType<QVariant>();
  bVar2 = ::operator==((QMetaType *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                       (QMetaType *)in_stack_fffffffffffffe48);
  pvVar5 = __buf;
  if (!bVar2) {
    pvVar5 = ::QVariant::data((QVariant *)
                              CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  }
  local_68 = pvVar5;
  pQVar6 = priv((this->mobj->d).data);
  if (((pQVar6->flags & 4U) == 0) ||
     ((this->mobj->d).static_metacall == (StaticMetacallFunction)0x0)) {
    pcVar3 = Data::index(&this->data,(char *)this->mobj,__c_00);
    cl = (Call)pcVar3;
    QMetaObject::propertyOffset((QMetaObject *)CONCAT44(cl,in_stack_fffffffffffffe50));
    QMetaObject::metacall(object,cl,in_stack_fffffffffffffe50,&in_stack_fffffffffffffe48->mobj);
  }
  else {
    p_Var8 = (this->mobj->d).static_metacall;
    pcVar3 = Data::index(&this->data,(char *)this->mobj,__c_00);
    (*p_Var8)(object,WriteProperty,(int)pcVar3,&local_68);
  }
  local_f1 = local_e4 != 0;
LAB_0036795c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_f1);
  }
  __stack_chk_fail();
}

Assistant:

bool QMetaProperty::write(QObject *object, QVariant &&v) const
{
    if (!object || !isWritable())
        return false;
    QMetaType t(mobj->d.metaTypes[data.index(mobj)]);
    if (t != QMetaType::fromType<QVariant>() && t != v.metaType()) {
        if (isEnumType() && !t.metaObject() && v.metaType() == QMetaType::fromType<QString>()) {
            // Assigning a string to a property of type Q_ENUMS (instead of Q_ENUM)
            // means the QMetaType has no associated QMetaObject, so it can't
            // do the conversion (see qmetatype.cpp:convertToEnum()).
            std::optional value = isFlagType() ? menum.keysToValue64(v.toByteArray())
                                               : menum.keyToValue64(v.toByteArray());
            if (value)
                v = QVariant(qlonglong(*value));

            // If the key(s)ToValue64 call failed, the convert() call below
            // gives QMetaType one last chance.
        }
        if (!v.isValid()) {
            if (isResettable())
                return reset(object);
            v = QVariant(t, nullptr);
        } else if (!v.convert(t)) {
            return false;
        }
    }
    // the status variable is changed by qt_metacall to indicate what it did
    // this feature is currently only used by Qt D-Bus and should not be depended
    // upon. Don't change it without looking into QDBusAbstractInterface first
    // -1 (unchanged): normal qt_metacall, result stored in argv[0]
    // changed: result stored directly in value, return the value of status
    int status = -1;
    // the flags variable is used by the declarative module to implement
    // interception of property writes.
    int flags = 0;
    void *argv[] = { nullptr, &v, &status, &flags };
    if (t == QMetaType::fromType<QVariant>())
        argv[0] = &v;
    else
        argv[0] = v.data();
    if (priv(mobj->d.data)->flags & PropertyAccessInStaticMetaCall && mobj->d.static_metacall)
        mobj->d.static_metacall(object, QMetaObject::WriteProperty, data.index(mobj), argv);
    else
        QMetaObject::metacall(object, QMetaObject::WriteProperty, data.index(mobj) + mobj->propertyOffset(), argv);

    return status;
}